

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

Text loguru::errno_as_text(void)

{
  int *piVar1;
  char *pcVar2;
  char *in_RDI;
  char buff [256];
  char acStack_108 [256];
  
  piVar1 = __errno_location();
  pcVar2 = strerror_r(*piVar1,acStack_108,0x100);
  pcVar2 = strdup(pcVar2);
  *(char **)in_RDI = pcVar2;
  return (Text)in_RDI;
}

Assistant:

Text errno_as_text()
	{
		char buff[256];
	#if defined(__GLIBC__) && defined(_GNU_SOURCE)
		// GNU Version
		return Text(STRDUP(strerror_r(errno, buff, sizeof(buff))));
	#elif defined(__APPLE__) || _POSIX_C_SOURCE >= 200112L
		// XSI Version
		strerror_r(errno, buff, sizeof(buff));
		return Text(strdup(buff));
	#elif defined(_WIN32)
		strerror_s(buff, sizeof(buff), errno);
		return Text(STRDUP(buff));
	#else
		// Not thread-safe.
		return Text(STRDUP(strerror(errno)));
	#endif
	}